

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::hufBuildEncTable(longlong *frq,int *im,int *iM)

{
  int iVar1;
  reference pvVar2;
  value_type plVar3;
  reference pplVar4;
  reference pplVar5;
  longlong *plVar6;
  reference pvVar7;
  int *in_RDX;
  int *in_RSI;
  void *in_RDI;
  longlong *in_stack_00000050;
  int j_1;
  int j;
  int m;
  int mm;
  vector<long_long,_std::allocator<long_long>_> scode;
  int i;
  int nf;
  vector<long_long_*,_std::allocator<long_long_*>_> fHeap;
  vector<int,_std::allocator<int>_> hlink;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  size_type __n;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  vector<long_long_*,_std::allocator<long_long_*>_> *this;
  int local_a4;
  int local_a0;
  vector<long_long,_std::allocator<long_long>_> local_88;
  int local_6c;
  int local_68;
  vector<long_long_*,_std::allocator<long_long_*>_> local_60 [2];
  vector<int,_std::allocator<int>_> local_30;
  int *local_18;
  int *local_10;
  void *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x49cd34);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (allocator_type *)in_stack_fffffffffffffee0);
  std::allocator<int>::~allocator((allocator<int> *)0x49cd5d);
  std::allocator<long_long_*>::allocator((allocator<long_long_*> *)0x49cd72);
  std::vector<long_long_*,_std::allocator<long_long_*>_>::vector
            ((vector<long_long_*,_std::allocator<long_long_*>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,(allocator_type *)in_stack_fffffffffffffee0);
  std::allocator<long_long_*>::~allocator((allocator<long_long_*> *)0x49cd9b);
  *local_10 = 0;
  while (*(long *)((long)local_8 + (long)*local_10 * 8) == 0) {
    *local_10 = *local_10 + 1;
  }
  local_68 = 0;
  for (local_6c = *local_10; iVar1 = local_6c, local_6c < 0x10001; local_6c = local_6c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_6c);
    *pvVar2 = iVar1;
    if (*(long *)((long)local_8 + (long)local_6c * 8) != 0) {
      plVar3 = (value_type)((long)local_8 + (long)local_6c * 8);
      pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[]
                          (local_60,(long)local_68);
      *pplVar4 = plVar3;
      local_68 = local_68 + 1;
      *local_18 = local_6c;
    }
  }
  *local_18 = *local_18 + 1;
  *(undefined8 *)((long)local_8 + (long)*local_18 * 8) = 1;
  plVar3 = (value_type)((long)local_8 + (long)*local_18 * 8);
  pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[]
                      (local_60,(long)local_68);
  *pplVar4 = plVar3;
  local_68 = local_68 + 1;
  pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[](local_60,0);
  pplVar5 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[]
                      (local_60,(long)local_68);
  std::make_heap<long_long**,tinyexr::FHeapCompare>(pplVar4,pplVar5);
  std::allocator<long_long>::allocator((allocator<long_long> *)0x49cfc3);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::allocator<long_long>::~allocator((allocator<long_long> *)0x49cfe9);
  plVar6 = std::vector<long_long,_std::allocator<long_long>_>::data
                     ((vector<long_long,_std::allocator<long_long>_> *)0x49cff6);
  memset(plVar6,0,0x80008);
  while (1 < local_68) {
    pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[](local_60,0);
    local_a4 = (int)((ulong)((long)*pplVar4 - (long)local_8) >> 3);
    pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[](local_60,0);
    pplVar5 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[]
                        (local_60,(long)local_68);
    std::pop_heap<long_long**,tinyexr::FHeapCompare>(pplVar4,pplVar5);
    local_68 = local_68 + -1;
    __n = 0;
    this = local_60;
    pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[](this,0);
    local_a0 = (int)((ulong)((long)*pplVar4 - (long)local_8) >> 3);
    pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[](this,__n);
    pplVar5 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[]
                        (this,(long)local_68);
    std::pop_heap<long_long**,tinyexr::FHeapCompare>(pplVar4,pplVar5);
    *(long *)((long)local_8 + (long)local_a0 * 8) =
         *(long *)((long)local_8 + (long)local_a0 * 8) +
         *(long *)((long)local_8 + (long)local_a4 * 8);
    in_stack_fffffffffffffee0 =
         (allocator_type *)
         std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[](local_60,0);
    pplVar4 = std::vector<long_long_*,_std::allocator<long_long_*>_>::operator[]
                        (local_60,(long)local_68);
    std::push_heap<long_long**,tinyexr::FHeapCompare>(in_stack_fffffffffffffee0,pplVar4);
    while( true ) {
      pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&local_88,(long)local_a0);
      *pvVar7 = *pvVar7 + 1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_a0);
      if (*pvVar2 == local_a0) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_a0);
      local_a0 = *pvVar2;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_a0);
    *pvVar2 = local_a4;
    while( true ) {
      pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&local_88,(long)local_a4);
      *pvVar7 = *pvVar7 + 1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_a4);
      if (*pvVar2 == local_a4) break;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_a4);
      local_a4 = *pvVar2;
    }
  }
  std::vector<long_long,_std::allocator<long_long>_>::data
            ((vector<long_long,_std::allocator<long_long>_> *)0x49d2e1);
  hufCanonicalCodeTable(in_stack_00000050);
  plVar6 = std::vector<long_long,_std::allocator<long_long>_>::data
                     ((vector<long_long,_std::allocator<long_long>_> *)0x49d304);
  memcpy(local_8,plVar6,0x80008);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffee0);
  std::vector<long_long_*,_std::allocator<long_long_*>_>::~vector
            ((vector<long_long_*,_std::allocator<long_long_*>_> *)in_stack_fffffffffffffee0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

static void hufBuildEncTable(
    long long *frq,  // io: input frequencies [HUF_ENCSIZE], output table
    int *im,         //  o: min frq index
    int *iM)         //  o: max frq index
{
  //
  // This function assumes that when it is called, array frq
  // indicates the frequency of all possible symbols in the data
  // that are to be Huffman-encoded.  (frq[i] contains the number
  // of occurrences of symbol i in the data.)
  //
  // The loop below does three things:
  //
  // 1) Finds the minimum and maximum indices that point
  //    to non-zero entries in frq:
  //
  //     frq[im] != 0, and frq[i] == 0 for all i < im
  //     frq[iM] != 0, and frq[i] == 0 for all i > iM
  //
  // 2) Fills array fHeap with pointers to all non-zero
  //    entries in frq.
  //
  // 3) Initializes array hlink such that hlink[i] == i
  //    for all array entries.
  //

  std::vector<int> hlink(HUF_ENCSIZE);
  std::vector<long long *> fHeap(HUF_ENCSIZE);

  *im = 0;

  while (!frq[*im]) (*im)++;

  int nf = 0;

  for (int i = *im; i < HUF_ENCSIZE; i++) {
    hlink[i] = i;

    if (frq[i]) {
      fHeap[nf] = &frq[i];
      nf++;
      *iM = i;
    }
  }

  //
  // Add a pseudo-symbol, with a frequency count of 1, to frq;
  // adjust the fHeap and hlink array accordingly.  Function
  // hufEncode() uses the pseudo-symbol for run-length encoding.
  //

  (*iM)++;
  frq[*iM] = 1;
  fHeap[nf] = &frq[*iM];
  nf++;

  //
  // Build an array, scode, such that scode[i] contains the number
  // of bits assigned to symbol i.  Conceptually this is done by
  // constructing a tree whose leaves are the symbols with non-zero
  // frequency:
  //
  //     Make a heap that contains all symbols with a non-zero frequency,
  //     with the least frequent symbol on top.
  //
  //     Repeat until only one symbol is left on the heap:
  //
  //         Take the two least frequent symbols off the top of the heap.
  //         Create a new node that has first two nodes as children, and
  //         whose frequency is the sum of the frequencies of the first
  //         two nodes.  Put the new node back into the heap.
  //
  // The last node left on the heap is the root of the tree.  For each
  // leaf node, the distance between the root and the leaf is the length
  // of the code for the corresponding symbol.
  //
  // The loop below doesn't actually build the tree; instead we compute
  // the distances of the leaves from the root on the fly.  When a new
  // node is added to the heap, then that node's descendants are linked
  // into a single linear list that starts at the new node, and the code
  // lengths of the descendants (that is, their distance from the root
  // of the tree) are incremented by one.
  //

  std::make_heap(&fHeap[0], &fHeap[nf], FHeapCompare());

  std::vector<long long> scode(HUF_ENCSIZE);
  memset(scode.data(), 0, sizeof(long long) * HUF_ENCSIZE);

  while (nf > 1) {
    //
    // Find the indices, mm and m, of the two smallest non-zero frq
    // values in fHeap, add the smallest frq to the second-smallest
    // frq, and remove the smallest frq value from fHeap.
    //

    int mm = fHeap[0] - frq;
    std::pop_heap(&fHeap[0], &fHeap[nf], FHeapCompare());
    --nf;

    int m = fHeap[0] - frq;
    std::pop_heap(&fHeap[0], &fHeap[nf], FHeapCompare());

    frq[m] += frq[mm];
    std::push_heap(&fHeap[0], &fHeap[nf], FHeapCompare());

    //
    // The entries in scode are linked into lists with the
    // entries in hlink serving as "next" pointers and with
    // the end of a list marked by hlink[j] == j.
    //
    // Traverse the lists that start at scode[m] and scode[mm].
    // For each element visited, increment the length of the
    // corresponding code by one bit. (If we visit scode[j]
    // during the traversal, then the code for symbol j becomes
    // one bit longer.)
    //
    // Merge the lists that start at scode[m] and scode[mm]
    // into a single list that starts at scode[m].
    //

    //
    // Add a bit to all codes in the first list.
    //

    for (int j = m;; j = hlink[j]) {
      scode[j]++;

      assert(scode[j] <= 58);

      if (hlink[j] == j) {
        //
        // Merge the two lists.
        //

        hlink[j] = mm;
        break;
      }
    }

    //
    // Add a bit to all codes in the second list
    //

    for (int j = mm;; j = hlink[j]) {
      scode[j]++;

      assert(scode[j] <= 58);

      if (hlink[j] == j) break;
    }
  }

  //
  // Build a canonical Huffman code table, replacing the code
  // lengths in scode with (code, code length) pairs.  Copy the
  // code table from scode into frq.
  //

  hufCanonicalCodeTable(scode.data());
  memcpy(frq, scode.data(), sizeof(long long) * HUF_ENCSIZE);
}